

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void assign_area_vnum(int vnum)

{
  AREA_DATA_conflict *pAVar1;
  int iVar2;
  int iVar3;
  short sVar4;
  
  pAVar1 = area_last;
  sVar4 = (short)vnum;
  if ((area_last->min_vnum == 0) || (area_last->max_vnum == 0)) {
    area_last->max_vnum = sVar4;
    pAVar1->min_vnum = sVar4;
  }
  iVar2 = (int)pAVar1->min_vnum;
  iVar3 = iVar2;
  if ((iVar2 <= vnum) && (iVar3 = (int)pAVar1->max_vnum, vnum <= pAVar1->max_vnum)) {
    iVar3 = vnum;
  }
  if (iVar3 != vnum) {
    if (vnum < iVar2) {
      pAVar1->min_vnum = sVar4;
      return;
    }
    pAVar1->max_vnum = sVar4;
  }
  return;
}

Assistant:

void assign_area_vnum(int vnum)
{
	if (area_last->min_vnum == 0 || area_last->max_vnum == 0)
		area_last->min_vnum = area_last->max_vnum = vnum;

	if (vnum != URANGE(area_last->min_vnum, vnum, area_last->max_vnum))
	{
		if (vnum < area_last->min_vnum)
			area_last->min_vnum = vnum;
		else
			area_last->max_vnum = vnum;
	}
}